

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  char *__s;
  uchar *outstart;
  byte *pbVar8;
  char nbuf [16];
  int local_78;
  uint local_64;
  int *local_60;
  uchar *local_58;
  byte *local_50;
  char local_48 [24];
  
  iVar2 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    local_60 = inlen;
    if (in == (uchar *)0x0) {
      *outlen = 0;
      local_58._0_4_ = 0;
      iVar2 = 0;
    }
    else {
      local_78 = (int)out;
      local_58 = in;
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        local_50 = out + *outlen;
        do {
          bVar1 = *in;
          if ((char)bVar1 < '\0') {
            lVar6 = 4 - (ulong)(bVar1 < 0xf0);
            if (bVar1 < 0xe0) {
              lVar6 = 2;
            }
            if ((long)pbVar8 - (long)in < lVar6) break;
            uVar7 = (uint)(bVar1 < 0xf0) * 8 + 7;
            if (bVar1 < 0xe0) {
              uVar7 = 0x1f;
            }
            uVar7 = uVar7 & bVar1;
            lVar3 = 1;
            do {
              uVar7 = in[lVar3] & 0x3f | uVar7 << 6;
              lVar3 = lVar3 + 1;
            } while (lVar6 != lVar3);
            local_64 = uVar7;
            pvVar4 = bsearch(&local_64,html40EntitiesTable,0xfd,0x18,htmlCompareEntityDesc);
            if (pvVar4 == (void *)0x0) {
              __s = local_48;
              snprintf(__s,0x10,"#%u",(ulong)uVar7);
            }
            else {
              __s = *(char **)((long)pvVar4 + 8);
            }
            sVar5 = strlen(__s);
            if ((long)local_50 - (long)out < (long)((sVar5 << 0x20) + 0x200000000) >> 0x20)
            goto LAB_00169326;
            *out = 0x26;
            sVar5 = (long)(sVar5 << 0x20) >> 0x20;
            memcpy(out + 1,__s,sVar5);
            out = out + sVar5 + 1;
            *out = 0x3b;
          }
          else {
            if (local_50 <= out) {
LAB_00169326:
              local_78 = (int)out - local_78;
              iVar2 = -3;
              goto LAB_0016932f;
            }
            *out = bVar1;
            lVar6 = 1;
          }
          in = in + lVar6;
          out = out + 1;
        } while (in < pbVar8);
      }
      local_78 = (int)out - local_78;
      iVar2 = local_78;
LAB_0016932f:
      *outlen = local_78;
      local_58._0_4_ = (int)in - (int)local_58;
    }
    *local_60 = (int)local_58;
  }
  return iVar2;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen) {
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned char* outstart = out;
    unsigned char* outend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        const htmlEntityDesc *ent;
        const char *cp;
        char nbuf[16];
        unsigned c, d;
        int seqlen, len, i;

	d = *in;

	if (d < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = d;
            in += 1;
            continue;
        }

        if (d < 0xE0)      { c = d & 0x1F; seqlen = 2; }
        else if (d < 0xF0) { c = d & 0x0F; seqlen = 3; }
        else               { c = d & 0x07; seqlen = 4; }

	if (inend - in < seqlen)
	    break;

	for (i = 1; i < seqlen; i++) {
	    d = in[i];
	    c <<= 6;
	    c |= d & 0x3F;
	}

        /*
         * Try to lookup a predefined HTML entity for it
         */
        ent = htmlEntityValueLookup(c);

        if (ent == NULL) {
          snprintf(nbuf, sizeof(nbuf), "#%u", c);
          cp = nbuf;
        } else {
          cp = ent->name;
        }

        len = strlen(cp);
        if (outend - out < len + 2)
            goto done;

        *out++ = '&';
        memcpy(out, cp, len);
        out += len;
        *out++ = ';';

        in += seqlen;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}